

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitDrop
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Drop *curr)

{
  undefined1 local_60 [8];
  Flow value;
  
  visit((Flow *)local_60,this,*(Expression **)(curr + 0x10));
  if (value.breakTo.super_IString.str._M_len == 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_60);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Flow visitDrop(Drop* curr) {
    NOTE_ENTER("Drop");
    Flow value = visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    return Flow();
  }